

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count128_lcg_shift.hpp
# Opt level: O2

result_type __thiscall trng::count128_lcg_shift::operator()(count128_lcg_shift *this)

{
  ulong uVar1;
  
  step(this);
  uVar1 = (*(ulong *)((long)&(this->S).r.value + 8) ^ (ulong)(this->S).r.value) * (this->P).a +
          (this->P).b;
  uVar1 = uVar1 >> 0x17 ^ uVar1;
  uVar1 = uVar1 << 0x29 ^ uVar1;
  return uVar1 >> 0x12 ^ uVar1;
}

Assistant:

TRNG_CUDA_ENABLE
  inline count128_lcg_shift::result_type count128_lcg_shift::operator()() {
    step();
    const result_type t_hi{S.r.hi()};
    const result_type t_lo{S.r.lo()};
    result_type t{(t_lo ^ t_hi) * P.a + P.b};
    t ^= (t >> 23u);
    t ^= (t << 41u);
    t ^= (t >> 18u);
    return t;
  }